

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O2

boolean write_full(int fd,void *buf,size_t count)

{
  ssize_t sVar1;
  
  while( true ) {
    if ((long)count < 1) {
      return '\x01';
    }
    sVar1 = write(fd,buf,count);
    if (sVar1 == -1) break;
    buf = (void *)((long)buf + sVar1);
    count = count - sVar1;
  }
  return '\0';
}

Assistant:

boolean write_full(int fd, const void *buf, size_t count)
{
	ssize_t ret, left;
	const char *buf2 = buf;

	left = count;
	while (left > 0) {
	    ret = write(fd, buf2, left);
	    if (ret == -1)
		return FALSE;
	    buf2 += ret;
	    left -= ret;
	}

	return TRUE;
}